

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void highbd_masked_variance
               (uint16_t *src_ptr,int src_stride,uint16_t *a_ptr,int a_stride,uint16_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int width,int height,uint64_t *sse,int *sum_
               )

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int iVar13;
  int iVar14;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  undefined1 auVar15 [16];
  int iVar20;
  int iVar21;
  undefined1 auVar22 [16];
  __m128i src_r;
  __m128i src_l;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  __m128i data_l;
  __m128i m_inv;
  __m128i m;
  __m128i b;
  __m128i a;
  __m128i src;
  __m128i zero;
  __m128i round_const;
  __m128i mask_max;
  __m128i sum_sq;
  __m128i sum;
  int y;
  int x;
  long local_4e8;
  long lStack_4e0;
  undefined1 local_4d8 [16];
  int local_4bc;
  int local_4b8;
  long local_4b0;
  long local_4a0;
  long local_490;
  byte local_438;
  byte bStack_437;
  byte bStack_436;
  byte bStack_435;
  byte bStack_434;
  byte bStack_433;
  byte bStack_432;
  byte bStack_431;
  undefined4 local_398;
  ushort uStack_336;
  ushort uStack_334;
  ushort uStack_332;
  ushort uStack_32e;
  ushort uStack_32c;
  ushort uStack_32a;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  ushort local_1f8;
  ushort uStack_1f6;
  ushort uStack_1f4;
  ushort uStack_1f2;
  ushort uStack_1d4;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  ushort uStack_190;
  ushort uStack_18e;
  ushort uStack_18c;
  ushort uStack_18a;
  ushort uStack_16c;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined2 uStack_150;
  undefined2 uStack_14e;
  undefined2 uStack_14c;
  undefined2 uStack_14a;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  uint uStack_c4;
  uint uStack_bc;
  uint uStack_a4;
  uint uStack_9c;
  __m128i tmp_1;
  __m128i tmp_0;
  __m128i sign;
  __m128i prod;
  __m128i tmp;
  __m128i diff_r;
  __m128i diff_l;
  
  local_4d8 = ZEXT816(0);
  local_4e8 = 0;
  lStack_4e0 = 0;
  local_4b0 = in_R8;
  local_4a0 = in_RDX;
  local_490 = in_RDI;
  for (local_4bc = 0; local_4bc < (int)pred_r[0]; local_4bc = local_4bc + 1) {
    for (local_4b8 = 0; local_4b8 < (int)src_l[1]; local_4b8 = local_4b8 + 8) {
      puVar1 = (undefined8 *)(local_490 + (long)local_4b8 * 2);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)(local_4a0 + (long)local_4b8 * 2);
      uVar5 = *puVar1;
      uVar6 = puVar1[1];
      puVar1 = (undefined8 *)(local_4b0 + (long)local_4b8 * 2);
      uVar7 = *puVar1;
      uVar8 = puVar1[1];
      uVar2 = *(undefined8 *)(src_r[1] + local_4b8);
      local_438 = (byte)uVar2;
      bStack_437 = (byte)((ulong)uVar2 >> 8);
      bStack_436 = (byte)((ulong)uVar2 >> 0x10);
      bStack_435 = (byte)((ulong)uVar2 >> 0x18);
      bStack_434 = (byte)((ulong)uVar2 >> 0x20);
      bStack_433 = (byte)((ulong)uVar2 >> 0x28);
      bStack_432 = (byte)((ulong)uVar2 >> 0x30);
      bStack_431 = (byte)((ulong)uVar2 >> 0x38);
      uStack_336 = (ushort)bStack_437;
      uStack_334 = (ushort)bStack_436;
      uStack_332 = (ushort)bStack_435;
      uStack_32e = (ushort)bStack_433;
      uStack_32c = (ushort)bStack_432;
      uStack_32a = (ushort)bStack_431;
      local_1b8 = (undefined2)uVar5;
      uStack_1b6 = (undefined2)((ulong)uVar5 >> 0x10);
      uStack_1b4 = (undefined2)((ulong)uVar5 >> 0x20);
      uStack_1b2 = (undefined2)((ulong)uVar5 >> 0x30);
      local_1c8 = (undefined2)uVar7;
      uStack_1c6 = (undefined2)((ulong)uVar7 >> 0x10);
      uStack_1c4 = (undefined2)((ulong)uVar7 >> 0x20);
      uStack_1c2 = (undefined2)((ulong)uVar7 >> 0x30);
      auVar22[1] = 0;
      auVar22[0] = local_438;
      uStack_1d4 = CONCAT11(0,bStack_436);
      auVar10._2_2_ = local_1c8;
      auVar10._0_2_ = local_1b8;
      auVar10._4_2_ = uStack_1b6;
      auVar10._6_2_ = uStack_1c6;
      auVar10._10_2_ = uStack_1c4;
      auVar10._8_2_ = uStack_1b4;
      auVar10._12_2_ = uStack_1b2;
      auVar10._14_2_ = uStack_1c2;
      auVar22._2_2_ = 0x40 - (ushort)local_438;
      auVar22[4] = bStack_437;
      auVar22[5] = 0;
      auVar22._6_2_ = 0x40 - uStack_336;
      auVar22._10_2_ = 0x40 - uStack_334;
      auVar22._8_2_ = uStack_1d4;
      auVar22[0xc] = bStack_435;
      auVar22[0xd] = 0;
      auVar22._14_2_ = 0x40 - uStack_332;
      auVar15 = pmaddwd(auVar10,auVar22);
      local_2a8 = auVar15._0_4_;
      iStack_2a4 = auVar15._4_4_;
      iStack_2a0 = auVar15._8_4_;
      iStack_29c = auVar15._12_4_;
      auVar22 = ZEXT416(6);
      uStack_150 = (undefined2)uVar6;
      uStack_14e = (undefined2)((ulong)uVar6 >> 0x10);
      uStack_14c = (undefined2)((ulong)uVar6 >> 0x20);
      uStack_14a = (undefined2)((ulong)uVar6 >> 0x30);
      uStack_160 = (undefined2)uVar8;
      uStack_15e = (undefined2)((ulong)uVar8 >> 0x10);
      uStack_15c = (undefined2)((ulong)uVar8 >> 0x20);
      uStack_15a = (undefined2)((ulong)uVar8 >> 0x30);
      auVar15[1] = 0;
      auVar15[0] = bStack_434;
      uStack_16c = CONCAT11(0,bStack_432);
      auVar9._2_2_ = uStack_160;
      auVar9._0_2_ = uStack_150;
      auVar9._4_2_ = uStack_14e;
      auVar9._6_2_ = uStack_15e;
      auVar9._10_2_ = uStack_15c;
      auVar9._8_2_ = uStack_14c;
      auVar9._12_2_ = uStack_14a;
      auVar9._14_2_ = uStack_15a;
      auVar15._2_2_ = 0x40 - (ushort)bStack_434;
      auVar15[4] = bStack_433;
      auVar15[5] = 0;
      auVar15._6_2_ = 0x40 - uStack_32e;
      auVar15._10_2_ = 0x40 - uStack_32c;
      auVar15._8_2_ = uStack_16c;
      auVar15[0xc] = bStack_431;
      auVar15[0xd] = 0;
      auVar15._14_2_ = 0x40 - uStack_32a;
      auVar15 = pmaddwd(auVar9,auVar15);
      local_2c8 = auVar15._0_4_;
      iStack_2c4 = auVar15._4_4_;
      iStack_2c0 = auVar15._8_4_;
      iStack_2bc = auVar15._12_4_;
      auVar15 = ZEXT416(6);
      local_1f8 = (ushort)uVar3;
      uStack_1f6 = (ushort)((ulong)uVar3 >> 0x10);
      uStack_1f4 = (ushort)((ulong)uVar3 >> 0x20);
      uStack_1f2 = (ushort)((ulong)uVar3 >> 0x30);
      uStack_190 = (ushort)uVar4;
      uStack_18e = (ushort)((ulong)uVar4 >> 0x10);
      uStack_18c = (ushort)((ulong)uVar4 >> 0x20);
      uStack_18a = (ushort)((ulong)uVar4 >> 0x30);
      uStack_a4 = (uint)uStack_1f6;
      uStack_9c = (uint)uStack_1f2;
      iVar13 = (local_2a8 + 0x20 >> auVar22) - (uint)local_1f8;
      iVar16 = (iStack_2a4 + 0x20 >> auVar22) - uStack_a4;
      iVar18 = (iStack_2a0 + 0x20 >> auVar22) - (uint)uStack_1f4;
      iVar20 = (iStack_29c + 0x20 >> auVar22) - uStack_9c;
      uStack_c4 = (uint)uStack_18e;
      uStack_bc = (uint)uStack_18a;
      iVar14 = (local_2c8 + 0x20 >> auVar15) - (uint)uStack_190;
      iVar17 = (iStack_2c4 + 0x20 >> auVar15) - uStack_c4;
      iVar19 = (iStack_2c0 + 0x20 >> auVar15) - (uint)uStack_18c;
      iVar21 = (iStack_2bc + 0x20 >> auVar15) - uStack_bc;
      local_308 = local_4d8._0_4_;
      iStack_304 = local_4d8._4_4_;
      iStack_300 = local_4d8._8_4_;
      iStack_2fc = local_4d8._12_4_;
      local_4d8._4_4_ = iStack_304 + iVar16 + iVar17;
      local_4d8._0_4_ = local_308 + iVar13 + iVar14;
      local_4d8._8_4_ = iStack_300 + iVar18 + iVar19;
      local_4d8._12_4_ = iStack_2fc + iVar20 + iVar21;
      auVar12._4_4_ = iVar16;
      auVar12._0_4_ = iVar13;
      auVar12._12_4_ = iVar20;
      auVar12._8_4_ = iVar18;
      auVar11._4_4_ = iVar17;
      auVar11._0_4_ = iVar14;
      auVar11._12_4_ = iVar21;
      auVar11._8_4_ = iVar19;
      auVar15 = packssdw(auVar12,auVar11);
      auVar15 = pmaddwd(auVar15,auVar15);
      local_118 = auVar15._0_4_;
      iStack_114 = auVar15._4_4_;
      iStack_110 = auVar15._8_4_;
      iStack_10c = auVar15._12_4_;
      auVar15 = ZEXT416(0x1f);
      local_4e8 = local_4e8 +
                  CONCAT44(local_118 >> auVar15,local_118) +
                  CONCAT44(iStack_110 >> auVar15,iStack_110);
      lStack_4e0 = lStack_4e0 +
                   CONCAT44(iStack_114 >> auVar15,iStack_114) +
                   CONCAT44(iStack_10c >> auVar15,iStack_10c);
    }
    local_490 = local_490 + (long)in_ESI * 2;
    local_4a0 = local_4a0 + (long)in_ECX * 2;
    local_4b0 = local_4b0 + (long)in_R9D * 2;
    src_r[1] = src_r[1] + (int)src_l[0];
  }
  auVar15 = phaddd(local_4d8,ZEXT816(0));
  auVar15 = phaddd(auVar15,ZEXT816(0));
  local_398 = auVar15._0_4_;
  *(undefined4 *)mask_r[0] = local_398;
  *(long *)pred_r[1] = local_4e8 + lStack_4e0;
  return;
}

Assistant:

static void highbd_masked_variance(const uint16_t *src_ptr, int src_stride,
                                   const uint16_t *a_ptr, int a_stride,
                                   const uint16_t *b_ptr, int b_stride,
                                   const uint8_t *m_ptr, int m_stride,
                                   int width, int height, uint64_t *sse,
                                   int *sum_) {
  int x, y;
  // Note on bit widths:
  // The maximum value of 'sum' is (2^12 - 1) * 128 * 128 =~ 2^26,
  // so this can be kept as four 32-bit values.
  // But the maximum value of 'sum_sq' is (2^12 - 1)^2 * 128 * 128 =~ 2^38,
  // so this must be stored as two 64-bit values.
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 8) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m =
          _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)&m_ptr[x]), zero);
      const __m128i m_inv = _mm_sub_epi16(mask_max, m);

      // Calculate 8 predicted pixels.
      const __m128i data_l = _mm_unpacklo_epi16(a, b);
      const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
      __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
      pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi16(a, b);
      const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
      __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
      pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i src_l = _mm_unpacklo_epi16(src, zero);
      const __m128i src_r = _mm_unpackhi_epi16(src, zero);
      __m128i diff_l = _mm_sub_epi32(pred_l, src_l);
      __m128i diff_r = _mm_sub_epi32(pred_r, src_r);

      // Update partial sums and partial sums of squares
      sum = _mm_add_epi32(sum, _mm_add_epi32(diff_l, diff_r));
      // A trick: Now each entry of diff_l and diff_r is stored in a 32-bit
      // field, but the range of values is only [-(2^12 - 1), 2^12 - 1].
      // So we can re-pack into 16-bit fields and use _mm_madd_epi16
      // to calculate the squares and partially sum them.
      const __m128i tmp = _mm_packs_epi32(diff_l, diff_r);
      const __m128i prod = _mm_madd_epi16(tmp, tmp);
      // Then we want to sign-extend to 64 bits and accumulate
      const __m128i sign = _mm_srai_epi32(prod, 31);
      const __m128i tmp_0 = _mm_unpacklo_epi32(prod, sign);
      const __m128i tmp_1 = _mm_unpackhi_epi32(prod, sign);
      sum_sq = _mm_add_epi64(sum_sq, _mm_add_epi64(tmp_0, tmp_1));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, zero);
  sum = _mm_hadd_epi32(sum, zero);
  *sum_ = _mm_cvtsi128_si32(sum);
  sum_sq = _mm_add_epi64(sum_sq, _mm_srli_si128(sum_sq, 8));
  _mm_storel_epi64((__m128i *)sse, sum_sq);
}